

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

void deallocAntecedentConsequentVectorsStruct(antecedentConsequentVectorsStruct *toBeDeleted)

{
  Vec_Int_t *pVVar1;
  
  if (toBeDeleted != (antecedentConsequentVectorsStruct *)0x0) {
    pVVar1 = toBeDeleted->attrAntecedents;
    if (pVVar1 != (Vec_Int_t *)0x0) {
      if (pVVar1->pArray != (int *)0x0) {
        free(pVVar1->pArray);
      }
      free(pVVar1);
    }
    pVVar1 = toBeDeleted->attrConsequentCandidates;
    if (pVVar1 != (Vec_Int_t *)0x0) {
      if (pVVar1->pArray != (int *)0x0) {
        free(pVVar1->pArray);
      }
      free(pVVar1);
    }
    free(toBeDeleted);
    return;
  }
  __assert_fail("toBeDeleted != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                ,0x40,
                "void deallocAntecedentConsequentVectorsStruct(struct antecedentConsequentVectorsStruct *)"
               );
}

Assistant:

void deallocAntecedentConsequentVectorsStruct(struct antecedentConsequentVectorsStruct *toBeDeleted)
{
	assert( toBeDeleted != NULL );
	if(toBeDeleted->attrAntecedents) 
		Vec_IntFree( toBeDeleted->attrAntecedents );
	if(toBeDeleted->attrConsequentCandidates)
		Vec_IntFree( toBeDeleted->attrConsequentCandidates );
	free( toBeDeleted );
}